

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

size_t mdns_string_find(char *str,size_t length,char c,size_t offset)

{
  void *pvVar1;
  size_t sVar2;
  
  sVar2 = 0xffffffffffffffff;
  if (offset <= length && length - offset != 0) {
    pvVar1 = memchr(str + offset,(int)c,length - offset);
    if (pvVar1 != (void *)0x0) {
      sVar2 = (long)pvVar1 - (long)str;
    }
  }
  return sVar2;
}

Assistant:

size_t
mdns_string_find(const char* str, size_t length, char c, size_t offset) {
	const void* found;
	if (offset >= length)
		return MDNS_INVALID_POS;
	found = memchr(str + offset, c, length - offset);
	if (found)
		return (size_t)((const char*)found - str);
	return MDNS_INVALID_POS;
}